

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2a21b2d::HighBDConvolveHorizRSTest::RunOne
          (HighBDConvolveHorizRSTest *this,bool ref)

{
  int src_stride;
  int dst_stride;
  int out_length;
  int h;
  int x0_qn;
  TestImage<unsigned_short> *pTVar1;
  int32_t x_step_qn;
  long lVar2;
  uint16_t *src;
  undefined7 in_register_00000031;
  long lVar3;
  uint16_t *dst;
  
  pTVar1 = (this->super_ConvolveHorizRSTestBase<unsigned_short>).image_;
  if ((int)CONCAT71(in_register_00000031,ref) == 0) {
    lVar2 = (long)pTVar1->src_stride_ * ((long)pTVar1->h_ + 0x40);
  }
  else {
    lVar2 = 0;
  }
  src_stride = pTVar1->src_stride_;
  if (ref) {
    lVar3 = 0;
  }
  else {
    lVar3 = (long)pTVar1->dst_stride_ * ((long)pTVar1->h_ + 0x40);
  }
  src = (pTVar1->src_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar2 + (long)src_stride * 0x20 + 0x20;
  dst_stride = pTVar1->dst_stride_;
  dst = (pTVar1->dst_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar3 + (long)dst_stride * 0x20 + 0x20;
  out_length = pTVar1->w_dst_;
  h = pTVar1->h_;
  x0_qn = pTVar1->x0_;
  x_step_qn = av1_get_upscale_convolve_step(pTVar1->w_src_,out_length);
  if (ref) {
    av1_highbd_convolve_horiz_rs_c
              (src,src_stride,dst,dst_stride,out_length,h,av1_resize_filter_normative[0],x0_qn,
               x_step_qn,(this->super_ConvolveHorizRSTestBase<unsigned_short>).bd_);
  }
  else {
    (*this->tst_fun_)(src,src_stride,dst,dst_stride,out_length,h,av1_resize_filter_normative[0],
                      x0_qn,x_step_qn,(this->super_ConvolveHorizRSTestBase<unsigned_short>).bd_);
  }
  return;
}

Assistant:

void RunOne(bool ref) override {
    const uint16_t *src = image_->GetSrcData(ref, false);
    uint16_t *dst = image_->GetDstData(ref, false);
    const int src_stride = image_->src_stride();
    const int dst_stride = image_->dst_stride();
    const int width_src = image_->src_width();
    const int width_dst = image_->dst_width();
    const int height = image_->height();
    const int x0_qn = image_->x0();

    const int32_t x_step_qn =
        av1_get_upscale_convolve_step(width_src, width_dst);

    if (ref) {
      av1_highbd_convolve_horiz_rs_c(
          src, src_stride, dst, dst_stride, width_dst, height,
          &av1_resize_filter_normative[0][0], x0_qn, x_step_qn, bd_);
    } else {
      tst_fun_(src, src_stride, dst, dst_stride, width_dst, height,
               &av1_resize_filter_normative[0][0], x0_qn, x_step_qn, bd_);
    }
  }